

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

spv_result_t
spvOpcodeTableValueLookup
          (spv_target_env env,spv_opcode_table table,Op opcode,spv_opcode_desc *pEntry)

{
  uint uVar1;
  spv_opcode_desc_t *psVar2;
  spv_opcode_desc_t *psVar3;
  uint32_t uVar4;
  bool bVar5;
  spv_opcode_desc_t *local_d0;
  spv_opcode_desc_t *it;
  uint32_t version;
  anon_class_1_0_00000001_for__M_comp comp;
  spv_opcode_desc_t needle;
  spv_opcode_desc_t *end;
  spv_opcode_desc_t *beg;
  spv_opcode_desc *pEntry_local;
  Op opcode_local;
  spv_opcode_table table_local;
  spv_target_env env_local;
  
  if (table == (spv_opcode_table)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  else if (pEntry == (spv_opcode_desc *)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else {
    psVar2 = table->entries;
    psVar3 = table->entries;
    uVar1 = table->count;
    memset(&version,0,0x88);
    _version = "";
    uVar4 = spvVersionForTargetEnv(env);
    local_d0 = std::
               lower_bound<spv_opcode_desc_t_const*,spv_opcode_desc_t,spvOpcodeTableValueLookup(spv_target_env,spv_opcode_table_t_const*,spv::Op,spv_opcode_desc_t_const**)::__0>
                         (psVar2,psVar3 + uVar1,&version);
    while( true ) {
      bVar5 = false;
      if (local_d0 != psVar3 + uVar1) {
        bVar5 = local_d0->opcode == opcode;
      }
      if (!bVar5) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      if ((((local_d0->minVersion <= uVar4) && (uVar4 <= local_d0->lastVersion)) ||
          (local_d0->numExtensions != 0)) || (local_d0->numCapabilities != 0)) break;
      local_d0 = local_d0 + 1;
    }
    *pEntry = local_d0;
    table_local._4_4_ = SPV_SUCCESS;
  }
  return table_local._4_4_;
}

Assistant:

spv_result_t spvOpcodeTableValueLookup(spv_target_env env,
                                       const spv_opcode_table table,
                                       const spv::Op opcode,
                                       spv_opcode_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  const auto beg = table->entries;
  const auto end = table->entries + table->count;

  spv_opcode_desc_t needle = {"", opcode, 0,     nullptr, 0,       {},  0,
                              {}, false,  false, 0,       nullptr, ~0u, ~0u};

  auto comp = [](const spv_opcode_desc_t& lhs, const spv_opcode_desc_t& rhs) {
    return lhs.opcode < rhs.opcode;
  };

  // We need to loop here because there can exist multiple symbols for the same
  // opcode value, and they can be introduced in different target environments,
  // which means they can have different minimal version requirements.
  // Assumes the underlying table is already sorted ascendingly according to
  // opcode value.
  const auto version = spvVersionForTargetEnv(env);
  for (auto it = std::lower_bound(beg, end, needle, comp);
       it != end && it->opcode == opcode; ++it) {
    // We considers the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if ((version >= it->minVersion && version <= it->lastVersion) ||
        it->numExtensions > 0u || it->numCapabilities > 0u) {
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}